

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O3

void issue457(void)

{
  roaring_bitmap_t *r;
  uint64_t uVar1;
  roaring_bitmap_t *r_00;
  
  r = roaring_bitmap_from_range(0x10003,0x10005,1);
  roaring_bitmap_printf_describe(r);
  uVar1 = roaring_bitmap_get_cardinality(r);
  _assert_true((ulong)(uVar1 == 2),"roaring_bitmap_get_cardinality(r1) == 2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x40);
  r_00 = roaring_bitmap_add_offset(r,-3);
  roaring_bitmap_printf_describe(r_00);
  uVar1 = roaring_bitmap_get_cardinality(r_00);
  _assert_true((ulong)(uVar1 == 2),"roaring_bitmap_get_cardinality(r2) == 2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x43);
  roaring_bitmap_printf(r_00);
  roaring_bitmap_free(r);
  roaring_bitmap_free(r_00);
  return;
}

Assistant:

DEFINE_TEST(issue457) {
    roaring_bitmap_t *r1 = roaring_bitmap_from_range(65539, 65541, 1);
    roaring_bitmap_printf_describe(r1);
    assert_true(roaring_bitmap_get_cardinality(r1) == 2);
    roaring_bitmap_t *r2 = roaring_bitmap_add_offset(r1, -3);
    roaring_bitmap_printf_describe(r2);
    assert_true(roaring_bitmap_get_cardinality(r2) == 2);
    roaring_bitmap_printf(r2);
    roaring_bitmap_free(r1);
    roaring_bitmap_free(r2);
}